

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageLevel.cpp
# Opt level: O0

void __thiscall Imf_3_2::ImageLevel::resize(ImageLevel *this,Box2i *dataWindow)

{
  ostream *poVar1;
  ArgExc *this_00;
  int *in_RSI;
  stringstream _iex_throw_s;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffe08;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffe10;
  stringstream local_198 [16];
  ostream local_188 [376];
  int *local_10;
  
  if ((*in_RSI + -1 <= in_RSI[2]) && (in_RSI[1] + -1 <= in_RSI[3])) {
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    return;
  }
  local_10 = in_RSI;
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Cannot reset data window for image level to (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_10);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[1]);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[2]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10[3]);
  std::operator<<(poVar1,"). The new data window is invalid.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageLevel::resize (const Box2i& dataWindow)
{
    if (dataWindow.max.x < dataWindow.min.x - 1 ||
        dataWindow.max.y < dataWindow.min.y - 1)
    {
        THROW (
            ArgExc,
            "Cannot reset data window for image level to "
            "(" << dataWindow.min.x
                << ", " << dataWindow.min.y
                << ") - "
                   "("
                << dataWindow.max.x << ", " << dataWindow.max.y
                << "). "
                   "The new data window is invalid.");
    }

    _dataWindow = dataWindow;
}